

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool testing::internal::InDeathTestChild(void)

{
  bool bVar1;
  byte bVar2;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  bVar2 = g_in_fast_death_test_child;
  if (bVar1) {
    bVar2 = DAT_0014f740 != 0;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool InDeathTestChild() {
# if GTEST_OS_WINDOWS

  // On Windows, death tests are thread-safe regardless of the value of the
  // death_test_style flag.
  return !GTEST_FLAG(internal_run_death_test).empty();

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe")
    return !GTEST_FLAG(internal_run_death_test).empty();
  else
    return g_in_fast_death_test_child;
#endif
}